

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O2

void Dio(double *x,int x_length,int fs,DioOption *option,double *temporal_positions,double *f0)

{
  double allowed_range;
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  fft_plan p_02;
  fft_plan p_03;
  fft_plan p_04;
  fft_plan p_05;
  double *yi;
  undefined8 uVar1;
  double *pdVar2;
  int i;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint y_length;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint x_length_00;
  uint x_length_01;
  double *pdVar10;
  long lVar11;
  fft_complex *out;
  double *pdVar12;
  long lVar13;
  fft_complex *padVar14;
  double **f0_candidates;
  long *plVar15;
  void *pvVar16;
  void *pvVar17;
  double *pdVar18;
  double *pdVar19;
  double *interval_locations;
  double *interval_locations_00;
  double *intervals;
  double *intervals_00;
  double *intervals_01;
  double *intervals_02;
  void *pvVar20;
  void *pvVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  fft_plan *pfVar35;
  int i_2;
  long lVar36;
  void *pvVar37;
  ulong uVar38;
  undefined8 *puVar39;
  ulong uVar40;
  ulong uVar41;
  int i_7;
  ulong uVar42;
  ulong uVar43;
  byte bVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  double dVar49;
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  undefined8 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd90 [64];
  double *in_stack_fffffffffffffdd0;
  int kMaximumNumber;
  fft_plan forwardFFT;
  fft_plan local_78;
  
  bVar44 = 0;
  dVar48 = option->frame_period;
  dVar51 = option->f0_floor;
  dVar47 = option->f0_ceil;
  dVar50 = option->channels_in_octave;
  iVar23 = option->speed;
  allowed_range = option->allowed_range;
  dVar45 = log(dVar47 / dVar51);
  iVar3 = (int)((dVar45 / 0.6931471805599453) * dVar50);
  uVar32 = (long)iVar3 + 1;
  uVar34 = (long)iVar3 * 8 + 8;
  if (iVar3 < -1) {
    uVar34 = 0xffffffffffffffff;
  }
  pdVar10 = (double *)operator_new__(uVar34);
  iVar8 = -1;
  if (-1 < iVar3) {
    iVar8 = iVar3;
  }
  lVar11 = (long)iVar8 + 1;
  lVar25 = 0;
  while (lVar11 != lVar25) {
    dVar45 = exp2((double)(int)(lVar25 + 1) / dVar50);
    pdVar10[lVar25] = dVar45 * dVar51;
    lVar25 = lVar25 + 1;
  }
  iVar3 = 0xc;
  if (iVar23 < 0xc) {
    iVar3 = iVar23;
  }
  iVar8 = 1;
  if (1 < iVar3) {
    iVar8 = iVar3;
  }
  dVar50 = (double)fs / (double)iVar8;
  iVar4 = matlab_round(dVar50 / 50.0);
  iVar3 = (int)((long)x_length / (long)iVar8);
  uVar5 = GetSuitableFFTSize(iVar3 + iVar4 * 2 + (int)((dVar50 / *pdVar10) * 0.5 + 1.0) * 4 + 2);
  lVar25 = (long)(int)uVar5;
  uVar42 = 0;
  uVar41 = 0;
  if (0 < (int)uVar5) {
    uVar41 = (ulong)uVar5;
  }
  uVar43 = lVar25 * 8;
  if ((int)uVar5 < 0) {
    uVar43 = 0xffffffffffffffff;
  }
  uVar38 = lVar25 << 4;
  if ((int)uVar5 < 0) {
    uVar38 = 0xffffffffffffffff;
  }
  out = (fft_complex *)operator_new__(uVar38);
  pdVar12 = (double *)operator_new__(uVar43);
  for (; uVar41 != uVar42; uVar42 = uVar42 + 1) {
    pdVar12[uVar42] = 0.0;
  }
  y_length = iVar3 + 1;
  if (iVar23 < 2) {
    uVar42 = 0;
    uVar41 = 0;
    if (0 < x_length) {
      uVar41 = (ulong)(uint)x_length;
    }
    for (; uVar41 != uVar42; uVar42 = uVar42 + 1) {
      pdVar12[uVar42] = x[uVar42];
    }
  }
  else {
    decimate(x,x_length,iVar8,pdVar12);
  }
  uVar41 = 0;
  uVar42 = 0;
  if (0 < (int)y_length) {
    uVar42 = (ulong)y_length;
  }
  dVar45 = 0.0;
  for (; uVar42 != uVar41; uVar41 = uVar41 + 1) {
    dVar45 = dVar45 + pdVar12[uVar41];
  }
  for (uVar41 = 0; uVar42 != uVar41; uVar41 = uVar41 + 1) {
    pdVar12[uVar41] = pdVar12[uVar41] - dVar45 / (double)(int)y_length;
  }
  for (lVar13 = (long)(int)y_length; lVar13 < lVar25; lVar13 = lVar13 + 1) {
    pdVar12[lVar13] = 0.0;
  }
  fft_plan_dft_r2c_1d(&forwardFFT,uVar5,pdVar12,out,3);
  pfVar35 = &forwardFFT;
  puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar39 = *(undefined8 *)pfVar35;
    pfVar35 = (fft_plan *)((long)pfVar35 + (ulong)bVar44 * -0x10 + 8);
    puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
  }
  p.flags = in_stack_fffffffffffffd90._0_4_;
  p._12_4_ = in_stack_fffffffffffffd90._4_4_;
  p.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
  p.in = (double *)in_stack_fffffffffffffd90._16_8_;
  p.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
  p.out = (double *)in_stack_fffffffffffffd90._32_8_;
  p.input = (double *)in_stack_fffffffffffffd90._40_8_;
  p.ip = (int *)in_stack_fffffffffffffd90._48_8_;
  p.w = (double *)in_stack_fffffffffffffd90._56_8_;
  p.n = (int)in_stack_fffffffffffffd88;
  p.sign = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  fft_execute(p);
  uVar6 = matlab_round(dVar50 / 50.0);
  uVar22 = uVar6 * 2 + 1;
  uVar7 = 0;
  if (0 < (int)uVar22) {
    uVar7 = uVar22;
  }
  uVar41 = 0;
  while (uVar7 * 2 != uVar41) {
    dVar45 = cos(((double)(uVar41 + 2 & 0xffffffff) * 3.141592653589793) /
                 (double)(int)(uVar6 * 2 + 2));
    *(double *)((long)pdVar12 + uVar41 * 4) = dVar45 * -0.5 + 0.5;
    uVar41 = uVar41 + 2;
  }
  for (lVar13 = (long)(int)uVar22; lVar13 < lVar25; lVar13 = lVar13 + 1) {
    pdVar12[lVar13] = 0.0;
  }
  uVar41 = (ulong)uVar7;
  dVar45 = 0.0;
  for (uVar26 = 0; uVar41 != uVar26; uVar26 = uVar26 + 1) {
    dVar45 = dVar45 + pdVar12[uVar26];
  }
  for (uVar26 = 0; uVar41 != uVar26; uVar26 = uVar26 + 1) {
    pdVar12[uVar26] = -pdVar12[uVar26] / dVar45;
  }
  uVar27 = 0;
  uVar26 = 0;
  if (0 < (int)uVar6) {
    uVar26 = (ulong)uVar6;
  }
  for (; uVar26 != uVar27; uVar27 = uVar27 + 1) {
    pdVar12[(long)(int)(uVar5 - uVar6) + uVar27] = pdVar12[uVar27];
  }
  for (uVar26 = 0; uVar41 != uVar26; uVar26 = uVar26 + 1) {
    pdVar12[uVar26] = pdVar12[(long)(int)uVar6 + uVar26];
  }
  *pdVar12 = *pdVar12 + 1.0;
  padVar14 = (fft_complex *)operator_new__(uVar38);
  forwardFFT.c_out = padVar14;
  pfVar35 = &forwardFFT;
  puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar39 = *(undefined8 *)pfVar35;
    pfVar35 = (fft_plan *)((long)pfVar35 + (ulong)bVar44 * -0x10 + 8);
    puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
  }
  p_00.flags = in_stack_fffffffffffffd90._0_4_;
  p_00._12_4_ = in_stack_fffffffffffffd90._4_4_;
  p_00.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
  p_00.in = (double *)in_stack_fffffffffffffd90._16_8_;
  p_00.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
  p_00.out = (double *)in_stack_fffffffffffffd90._32_8_;
  p_00.input = (double *)in_stack_fffffffffffffd90._40_8_;
  p_00.ip = (int *)in_stack_fffffffffffffd90._48_8_;
  p_00.w = (double *)in_stack_fffffffffffffd90._56_8_;
  p_00.n = (int)in_stack_fffffffffffffd88;
  p_00.sign = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
  fft_execute(p_00);
  iVar4 = (int)uVar5 / 2;
  iVar23 = -1;
  if (-1 < iVar4) {
    iVar23 = iVar4;
  }
  for (lVar13 = 0; (ulong)(iVar23 + 1) << 4 != lVar13; lVar13 = lVar13 + 0x10) {
    dVar45 = *(double *)((long)*out + lVar13);
    dVar49 = *(double *)((long)*out + lVar13 + 8);
    pdVar18 = (double *)((long)*padVar14 + lVar13);
    dVar52 = *pdVar18;
    dVar53 = pdVar18[1];
    pdVar18 = (double *)((long)*out + lVar13);
    *pdVar18 = dVar45 * dVar52 + dVar53 * -dVar49;
    pdVar18[1] = dVar45 * dVar53 + dVar52 * dVar49;
  }
  pfVar35 = &forwardFFT;
  puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
  for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
    *puVar39 = *(undefined8 *)pfVar35;
    pfVar35 = (fft_plan *)((long)pfVar35 + (ulong)bVar44 * -0x10 + 8);
    puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
  }
  p_03.w = in_stack_fffffffffffffdd0;
  p_03.n = in_stack_fffffffffffffd90._0_4_;
  p_03.sign = in_stack_fffffffffffffd90._4_4_;
  p_03.flags = in_stack_fffffffffffffd90._8_4_;
  p_03._12_4_ = in_stack_fffffffffffffd90._12_4_;
  p_03.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
  p_03.in = (double *)in_stack_fffffffffffffd90._24_8_;
  p_03.c_out = (fft_complex *)in_stack_fffffffffffffd90._32_8_;
  p_03.out = (double *)in_stack_fffffffffffffd90._40_8_;
  p_03.input = (double *)in_stack_fffffffffffffd90._48_8_;
  p_03.ip = (int *)in_stack_fffffffffffffd90._56_8_;
  fft_destroy_plan(p_03);
  operator_delete__(pdVar12);
  operator_delete__(padVar14);
  f0_candidates = (double **)operator_new__(uVar34);
  plVar15 = (long *)operator_new__(uVar34);
  iVar23 = (int)((((double)x_length * 1000.0) / (double)fs) / dVar48);
  uVar7 = iVar23 + 1;
  lVar13 = (long)(int)uVar7;
  uVar34 = lVar13 * 8;
  if (iVar23 < -1) {
    uVar34 = 0xffffffffffffffff;
  }
  for (lVar36 = 0; lVar11 != lVar36; lVar36 = lVar36 + 1) {
    pdVar12 = (double *)operator_new__(uVar34);
    f0_candidates[lVar36] = pdVar12;
    pvVar16 = operator_new__(uVar34);
    plVar15[lVar36] = (long)pvVar16;
  }
  lVar28 = (long)iVar23;
  lVar36 = -1;
  if (-1 < lVar28) {
    lVar36 = lVar28;
  }
  for (lVar29 = 0; lVar36 + 1 != lVar29; lVar29 = lVar29 + 1) {
    temporal_positions[lVar29] = ((double)(int)lVar29 * dVar48) / 1000.0;
  }
  uVar41 = lVar13 * 8;
  if (iVar23 < -1) {
    uVar41 = 0xffffffffffffffff;
  }
  pvVar16 = operator_new__(uVar41);
  pvVar17 = operator_new__(uVar41);
  uVar26 = (ulong)y_length << 3;
  if (iVar3 < -1) {
    uVar26 = 0xffffffffffffffff;
  }
  uVar40 = 0;
  uVar27 = (long)x_length / (long)iVar8 & 0xffffffff;
  if (iVar3 < 1) {
    uVar27 = uVar40;
  }
  uVar33 = 0;
  if (0 < (int)uVar7) {
    uVar33 = (ulong)uVar7;
  }
  iVar8 = (int)uVar32;
  uVar30 = 0;
  if (0 < iVar8) {
    uVar30 = uVar32 & 0xffffffff;
  }
  for (; uVar40 != uVar30; uVar40 = uVar40 + 1) {
    dVar45 = pdVar10[uVar40];
    pdVar12 = (double *)operator_new__(uVar43);
    iVar9 = matlab_round((dVar50 / dVar45) * 0.5);
    pdVar18 = (double *)operator_new__(uVar43);
    NuttallWindow(iVar9 * 4,pdVar18);
    for (lVar36 = (long)(iVar9 * 4); lVar36 < lVar25; lVar36 = lVar36 + 1) {
      pdVar18[lVar36] = 0.0;
    }
    padVar14 = (fft_complex *)operator_new__(uVar38);
    fft_plan_dft_r2c_1d(&forwardFFT,uVar5,pdVar18,padVar14,3);
    pfVar35 = &forwardFFT;
    puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
    for (lVar36 = 9; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar39 = *(undefined8 *)pfVar35;
      pfVar35 = (fft_plan *)((long)pfVar35 + (ulong)bVar44 * -0x10 + 8);
      puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
    }
    p_01.flags = in_stack_fffffffffffffd90._0_4_;
    p_01._12_4_ = in_stack_fffffffffffffd90._4_4_;
    p_01.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
    p_01.in = (double *)in_stack_fffffffffffffd90._16_8_;
    p_01.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
    p_01.out = (double *)in_stack_fffffffffffffd90._32_8_;
    p_01.input = (double *)in_stack_fffffffffffffd90._40_8_;
    p_01.ip = (int *)in_stack_fffffffffffffd90._48_8_;
    p_01.w = (double *)in_stack_fffffffffffffd90._56_8_;
    p_01.n = (int)in_stack_fffffffffffffd88;
    p_01.sign = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    fft_execute(p_01);
    dVar49 = (*out)[0];
    dVar52 = (*out)[1];
    dVar53 = (*padVar14)[0];
    dVar54 = (*padVar14)[1];
    (*padVar14)[0] = dVar49 * dVar53 + dVar54 * -dVar52;
    (*padVar14)[1] = dVar49 * dVar54 + dVar53 * dVar52;
    lVar36 = 0x10;
    iVar24 = uVar5 - 2;
    for (lVar29 = 1; lVar29 <= iVar4; lVar29 = lVar29 + 1) {
      dVar49 = *(double *)((long)*out + lVar36);
      dVar52 = *(double *)((long)*out + lVar36 + 8);
      pdVar19 = (double *)((long)*padVar14 + lVar36);
      dVar53 = *pdVar19;
      dVar54 = pdVar19[1];
      dVar46 = dVar49 * dVar53 + dVar54 * -dVar52;
      dVar49 = dVar49 * dVar54 + dVar53 * dVar52;
      pdVar19 = (double *)((long)*padVar14 + lVar36);
      *pdVar19 = dVar46;
      pdVar19[1] = dVar49;
      padVar14[iVar24][0] = dVar46;
      padVar14[iVar24][1] = dVar49;
      iVar24 = iVar24 + -1;
      lVar36 = lVar36 + 0x10;
    }
    fft_plan_dft_c2r_1d(&local_78,uVar5,padVar14,pdVar12,3);
    pfVar35 = &local_78;
    puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
    for (lVar36 = 9; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar39 = *(undefined8 *)pfVar35;
      pfVar35 = (fft_plan *)((long)pfVar35 + ((ulong)bVar44 * -2 + 1) * 8);
      puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
    }
    p_02.flags = in_stack_fffffffffffffd90._0_4_;
    p_02._12_4_ = in_stack_fffffffffffffd90._4_4_;
    p_02.c_in = (fft_complex *)in_stack_fffffffffffffd90._8_8_;
    p_02.in = (double *)in_stack_fffffffffffffd90._16_8_;
    p_02.c_out = (fft_complex *)in_stack_fffffffffffffd90._24_8_;
    p_02.out = (double *)in_stack_fffffffffffffd90._32_8_;
    p_02.input = (double *)in_stack_fffffffffffffd90._40_8_;
    p_02.ip = (int *)in_stack_fffffffffffffd90._48_8_;
    p_02.w = (double *)in_stack_fffffffffffffd90._56_8_;
    p_02.n = (int)in_stack_fffffffffffffd88;
    p_02.sign = (int)((ulong)in_stack_fffffffffffffd88 >> 0x20);
    fft_execute(p_02);
    for (uVar31 = 0; uVar42 != uVar31; uVar31 = uVar31 + 1) {
      pdVar12[uVar31] = pdVar12[(long)(iVar9 * 2) + uVar31];
    }
    pfVar35 = &local_78;
    puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
    for (lVar36 = 9; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar39 = *(undefined8 *)pfVar35;
      pfVar35 = (fft_plan *)((long)pfVar35 + ((ulong)bVar44 * -2 + 1) * 8);
      puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
    }
    p_04.w = in_stack_fffffffffffffdd0;
    p_04.n = in_stack_fffffffffffffd90._0_4_;
    p_04.sign = in_stack_fffffffffffffd90._4_4_;
    p_04.flags = in_stack_fffffffffffffd90._8_4_;
    p_04._12_4_ = in_stack_fffffffffffffd90._12_4_;
    p_04.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
    p_04.in = (double *)in_stack_fffffffffffffd90._24_8_;
    p_04.c_out = (fft_complex *)in_stack_fffffffffffffd90._32_8_;
    p_04.out = (double *)in_stack_fffffffffffffd90._40_8_;
    p_04.input = (double *)in_stack_fffffffffffffd90._48_8_;
    p_04.ip = (int *)in_stack_fffffffffffffd90._56_8_;
    fft_destroy_plan(p_04);
    pfVar35 = &forwardFFT;
    puVar39 = (undefined8 *)&stack0xfffffffffffffd88;
    for (lVar36 = 9; lVar36 != 0; lVar36 = lVar36 + -1) {
      *puVar39 = *(undefined8 *)pfVar35;
      pfVar35 = (fft_plan *)((long)pfVar35 + (ulong)bVar44 * -0x10 + 8);
      puVar39 = puVar39 + (ulong)bVar44 * -2 + 1;
    }
    p_05.w = in_stack_fffffffffffffdd0;
    p_05.n = in_stack_fffffffffffffd90._0_4_;
    p_05.sign = in_stack_fffffffffffffd90._4_4_;
    p_05.flags = in_stack_fffffffffffffd90._8_4_;
    p_05._12_4_ = in_stack_fffffffffffffd90._12_4_;
    p_05.c_in = (fft_complex *)in_stack_fffffffffffffd90._16_8_;
    p_05.in = (double *)in_stack_fffffffffffffd90._24_8_;
    p_05.c_out = (fft_complex *)in_stack_fffffffffffffd90._32_8_;
    p_05.out = (double *)in_stack_fffffffffffffd90._40_8_;
    p_05.input = (double *)in_stack_fffffffffffffd90._48_8_;
    p_05.ip = (int *)in_stack_fffffffffffffd90._56_8_;
    fft_destroy_plan(p_05);
    operator_delete__(padVar14);
    operator_delete__(pdVar18);
    pdVar18 = (double *)operator_new__(uVar26);
    pdVar19 = (double *)operator_new__(uVar26);
    interval_locations = (double *)operator_new__(uVar26);
    interval_locations_00 = (double *)operator_new__(uVar26);
    intervals = (double *)operator_new__(uVar26);
    intervals_00 = (double *)operator_new__(uVar26);
    intervals_01 = (double *)operator_new__(uVar26);
    intervals_02 = (double *)operator_new__(uVar26);
    uVar6 = anon_unknown.dwarf_9021::ZeroCrossingEngine(pdVar12,y_length,dVar50,pdVar18,intervals);
    for (uVar31 = 0; uVar42 != uVar31; uVar31 = uVar31 + 1) {
      pdVar12[uVar31] = -pdVar12[uVar31];
    }
    uVar22 = anon_unknown.dwarf_9021::ZeroCrossingEngine
                       (pdVar12,y_length,dVar50,pdVar19,intervals_00);
    for (uVar31 = 0; uVar27 != uVar31; uVar31 = uVar31 + 1) {
      pdVar12[uVar31] = pdVar12[uVar31] - pdVar12[uVar31 + 1];
    }
    x_length_00 = anon_unknown.dwarf_9021::ZeroCrossingEngine
                            (pdVar12,iVar3,dVar50,interval_locations,intervals_01);
    for (uVar31 = 0; uVar27 != uVar31; uVar31 = uVar31 + 1) {
      pdVar12[uVar31] = -pdVar12[uVar31];
    }
    x_length_01 = anon_unknown.dwarf_9021::ZeroCrossingEngine
                            (pdVar12,iVar3,dVar50,interval_locations_00,intervals_02);
    if ((((uVar6 < 3) || (uVar22 < 3)) || (x_length_00 < 3)) || (x_length_01 < 3)) {
      for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
        *(undefined8 *)((long)pvVar17 + uVar31 * 8) = 0x40f86a0000000000;
        *(undefined8 *)((long)pvVar16 + uVar31 * 8) = 0;
      }
    }
    else {
      for (lVar36 = 0; lVar36 != 4; lVar36 = lVar36 + 1) {
        pvVar20 = operator_new__(uVar41);
        *(void **)(&forwardFFT.n + lVar36 * 2) = pvVar20;
      }
      yi = (double *)CONCAT44(forwardFFT.sign,forwardFFT.n);
      interp1(pdVar18,intervals,uVar6,temporal_positions,uVar7,yi);
      uVar1 = forwardFFT._8_8_;
      interp1(pdVar19,intervals_00,uVar22,temporal_positions,uVar7,(double *)forwardFFT._8_8_);
      padVar14 = forwardFFT.c_in;
      interp1(interval_locations,intervals_01,x_length_00,temporal_positions,uVar7,*forwardFFT.c_in)
      ;
      pdVar2 = forwardFFT.in;
      interp1(interval_locations_00,intervals_02,x_length_01,temporal_positions,uVar7,forwardFFT.in)
      ;
      for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
        dVar49 = yi[uVar31];
        dVar52 = *(double *)(uVar1 + uVar31 * 8);
        dVar53 = (*padVar14)[uVar31];
        dVar54 = pdVar2[uVar31];
        dVar46 = (dVar49 + dVar52 + dVar53 + dVar54) * 0.25;
        *(double *)((long)pvVar16 + uVar31 * 8) = dVar46;
        dVar49 = dVar49 - dVar46;
        dVar52 = dVar52 - dVar46;
        dVar53 = dVar53 - dVar46;
        dVar54 = dVar54 - dVar46;
        *(double *)((long)pvVar17 + uVar31 * 8) =
             SQRT((dVar54 * dVar54 + dVar53 * dVar53 + dVar49 * dVar49 + dVar52 * dVar52) / 3.0);
        if (((dVar46 < dVar51) || (dVar47 < dVar46)) ||
           ((dVar45 < dVar46 || (dVar46 < dVar45 * 0.5)))) {
          *(undefined8 *)((long)pvVar16 + uVar31 * 8) = 0;
          *(undefined8 *)((long)pvVar17 + uVar31 * 8) = 0x40f86a0000000000;
        }
      }
      for (lVar36 = 0; lVar36 != 4; lVar36 = lVar36 + 1) {
        if (*(void **)(&forwardFFT.n + lVar36 * 2) != (void *)0x0) {
          operator_delete__(*(void **)(&forwardFFT.n + lVar36 * 2));
        }
      }
    }
    operator_delete__(pdVar18);
    operator_delete__(pdVar19);
    operator_delete__(interval_locations);
    operator_delete__(interval_locations_00);
    operator_delete__(intervals);
    operator_delete__(intervals_00);
    operator_delete__(intervals_01);
    operator_delete__(intervals_02);
    operator_delete__(pdVar12);
    for (uVar31 = 0; uVar33 != uVar31; uVar31 = uVar31 + 1) {
      dVar45 = *(double *)((long)pvVar16 + uVar31 * 8);
      *(double *)(plVar15[uVar40] + uVar31 * 8) =
           *(double *)((long)pvVar17 + uVar31 * 8) / (dVar45 + 1e-12);
      f0_candidates[uVar40][uVar31] = dVar45;
    }
  }
  operator_delete__(pvVar16);
  operator_delete__(pvVar17);
  pvVar16 = operator_new__(uVar34);
  for (uVar42 = 0; uVar42 != uVar33; uVar42 = uVar42 + 1) {
    dVar47 = *(double *)(*plVar15 + uVar42 * 8);
    *(double *)((long)pvVar16 + uVar42 * 8) = (*f0_candidates)[uVar42];
    for (lVar25 = 1; lVar25 < (long)uVar32; lVar25 = lVar25 + 1) {
      dVar50 = *(double *)(plVar15[lVar25] + uVar42 * 8);
      if (dVar50 < dVar47) {
        *(double *)((long)pvVar16 + uVar42 * 8) = f0_candidates[lVar25][uVar42];
        dVar47 = dVar50;
      }
    }
  }
  iVar3 = (int)((1000.0 / dVar48) / dVar51 + 0.5);
  if (iVar3 * 2 < iVar23) {
    uVar5 = iVar3 * 2 + 1;
    pdVar12 = (double *)operator_new__(uVar34);
    pvVar17 = operator_new__(uVar34);
    pvVar20 = operator_new__(uVar41);
    uVar32 = 0;
    uVar34 = 0;
    if (0 < (int)uVar5) {
      uVar34 = (ulong)uVar5;
    }
    for (; uVar34 != uVar32; uVar32 = uVar32 + 1) {
      *(undefined8 *)((long)pvVar20 + uVar32 * 8) = 0;
    }
    lVar29 = (long)(int)(uVar7 - uVar5);
    lVar36 = (long)(int)uVar5;
    for (lVar25 = lVar36; lVar25 < lVar29; lVar25 = lVar25 + 1) {
      *(undefined8 *)((long)pvVar20 + lVar25 * 8) = *(undefined8 *)((long)pvVar16 + lVar25 * 8);
    }
    for (; lVar29 < lVar13; lVar29 = lVar29 + 1) {
      *(undefined8 *)((long)pvVar20 + lVar29 * 8) = 0;
    }
    for (uVar32 = 0; uVar34 != uVar32; uVar32 = uVar32 + 1) {
      pdVar12[uVar32] = 0.0;
    }
    for (; lVar13 != lVar36; lVar36 = lVar36 + 1) {
      dVar48 = *(double *)((long)pvVar20 + lVar36 * 8);
      pdVar12[lVar36] =
           (double)(-(ulong)(ABS((dVar48 - *(double *)((long)pvVar20 + lVar36 * 8 + -8)) /
                                 (dVar48 + 1e-12)) < allowed_range) & (ulong)dVar48);
    }
    operator_delete__(pvVar20);
    for (uVar32 = 0; uVar33 != uVar32; uVar32 = uVar32 + 1) {
      *(double *)((long)pvVar17 + uVar32 * 8) = pdVar12[uVar32];
    }
    iVar4 = uVar7 - iVar3;
    if ((int)(uVar7 - iVar3) < iVar3) {
      iVar4 = iVar3;
    }
    pdVar18 = pdVar12;
    for (lVar25 = (long)iVar3; pdVar19 = pdVar18, lVar36 = (long)-iVar3, lVar25 != iVar4;
        lVar25 = lVar25 + 1) {
      do {
        if (iVar3 < lVar36) goto LAB_00106494;
        dVar48 = *pdVar19;
        lVar36 = lVar36 + 1;
        pdVar19 = pdVar19 + 1;
      } while ((dVar48 != 0.0) || (NAN(dVar48)));
      *(undefined8 *)((long)pvVar17 + lVar25 * 8) = 0;
LAB_00106494:
      pdVar18 = pdVar18 + 1;
    }
    uVar32 = lVar13 * 4;
    if (iVar23 < -1) {
      uVar32 = 0xffffffffffffffff;
    }
    pvVar20 = operator_new__(uVar32);
    pvVar21 = operator_new__(uVar32);
    local_78.n = 0;
    forwardFFT.n = 0;
    for (lVar25 = 1; lVar25 < lVar13; lVar25 = lVar25 + 1) {
      dVar48 = *(double *)((long)pvVar17 + lVar25 * 8);
      iVar23 = (int)lVar25;
      if ((dVar48 != 0.0) || (NAN(dVar48))) {
        dVar51 = *(double *)((long)pvVar17 + lVar25 * 8 + -8);
LAB_00106533:
        if ((dVar48 != 0.0) || (NAN(dVar48))) {
          pfVar35 = &forwardFFT;
          if ((dVar51 == 0.0) && (pvVar37 = pvVar20, !NAN(dVar51))) goto LAB_00106553;
        }
      }
      else {
        dVar51 = *(double *)((long)pvVar17 + lVar25 * 8 + -8);
        if ((dVar51 == 0.0) && (!NAN(dVar51))) goto LAB_00106533;
        iVar23 = iVar23 + -1;
        pfVar35 = &local_78;
        pvVar37 = pvVar21;
LAB_00106553:
        iVar3 = pfVar35->n;
        pfVar35->n = iVar3 + 1;
        *(int *)((long)pvVar37 + (long)iVar3 * 4) = iVar23;
      }
    }
    for (uVar32 = 0; uVar33 != uVar32; uVar32 = uVar32 + 1) {
      pdVar12[uVar32] = *(double *)((long)pvVar17 + uVar32 * 8);
    }
    uVar5 = local_78.n - 1;
    uVar34 = 0;
    uVar32 = (ulong)(uint)local_78.n;
    if (local_78.n < 1) {
      uVar32 = uVar34;
    }
    for (; uVar34 != uVar32; uVar34 = uVar34 + 1) {
      lVar25 = lVar28;
      if (uVar34 != uVar5) {
        lVar25 = (long)*(int *)((long)pvVar21 + uVar34 * 4 + 4);
      }
      iVar23 = *(int *)((long)pvVar21 + uVar34 * 4);
      iVar3 = iVar23 + 1;
      lVar13 = (long)iVar23;
      do {
        if (lVar25 <= lVar13) break;
        lVar36 = lVar13 + 1;
        dVar48 = anon_unknown.dwarf_9021::SelectBestF0
                           (pdVar12[lVar13],pdVar12[lVar13 + -1],f0_candidates,iVar8,iVar3,
                            allowed_range);
        pdVar12[lVar13 + 1] = dVar48;
        iVar3 = iVar3 + 1;
        lVar13 = lVar36;
      } while ((dVar48 != 0.0) || (NAN(dVar48)));
    }
    for (uVar32 = 0; uVar34 = (ulong)(uint)forwardFFT.n, uVar33 != uVar32; uVar32 = uVar32 + 1) {
      f0[uVar32] = pdVar12[uVar32];
    }
LAB_00106675:
    if (0 < (int)uVar34) {
      uVar32 = uVar34 - 1;
      lVar25 = 1;
      if ((uVar32 & 0xffffffff) != 0) {
        lVar25 = (long)*(int *)((long)pvVar20 + uVar34 * 4 + -8);
      }
      iVar23 = *(int *)((long)pvVar20 + (uVar32 & 0xffffffff) * 4);
      iVar3 = iVar23 + -1;
      lVar13 = (long)iVar23;
      do {
        uVar34 = uVar32;
        if (lVar13 <= lVar25) break;
        lVar36 = lVar13 + -1;
        dVar48 = anon_unknown.dwarf_9021::SelectBestF0
                           (f0[lVar13],f0[lVar13 + 1],f0_candidates,iVar8,iVar3,allowed_range);
        f0[lVar13 + -1] = dVar48;
        iVar3 = iVar3 + -1;
        lVar13 = lVar36;
      } while ((dVar48 != 0.0) || (NAN(dVar48)));
      goto LAB_00106675;
    }
    operator_delete__(pdVar12);
    operator_delete__(pvVar17);
    operator_delete__(pvVar20);
    operator_delete__(pvVar21);
  }
  operator_delete__(pvVar16);
  operator_delete__(out);
  for (lVar25 = 0; lVar11 != lVar25; lVar25 = lVar25 + 1) {
    if ((void *)plVar15[lVar25] != (void *)0x0) {
      operator_delete__((void *)plVar15[lVar25]);
    }
    if (f0_candidates[lVar25] != (double *)0x0) {
      operator_delete__(f0_candidates[lVar25]);
    }
  }
  operator_delete__(plVar15);
  operator_delete__(f0_candidates);
  operator_delete__(pdVar10);
  return;
}

Assistant:

void Dio(const double *x, int x_length, int fs, const DioOption *option,
    double *temporal_positions, double *f0) {
  DioGeneralBody(x, x_length, fs, option->frame_period, option->f0_floor,
      option->f0_ceil, option->channels_in_octave, option->speed,
      option->allowed_range, temporal_positions, f0);
}